

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O3

int64_t __thiscall QuickConnection::TimeUntilNextProcess(QuickConnection *this)

{
  PacingSender *this_00;
  QuicTime now;
  Delta DVar1;
  undefined4 extraout_var;
  
  this_00 = (this->_pacing_sender)._M_t.
            super___uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>._M_t
            .super__Tuple_impl<0UL,_quic::PacingSender_*,_std::default_delete<quic::PacingSender>_>.
            super__Head_base<0UL,_quic::PacingSender_*,_false>._M_head_impl;
  now.time_._0_4_ =
       (*((this->_clock)._M_t.
          super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
          super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
          super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3])();
  now.time_._4_4_ = extraout_var;
  DVar1 = quic::PacingSender::TimeUntilSend
                    (this_00,now,
                     ((this->_unacked_packet_map)._M_t.
                      super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
                      .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl)->
                     _bytes_in_flight);
  if (((((this->_wait_send_packets)._M_t.
         super___uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_RingBuffer<QuickPacket>_*,_std::default_delete<RingBuffer<QuickPacket>_>_>
         .super__Head_base<0UL,_RingBuffer<QuickPacket>_*,_false>._M_head_impl)->_packet_count).
       super___atomic_base<unsigned_short>._M_i == 0) &&
     ((this->_wait_retransmission_packets).
      super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node._M_size == 0
     )) {
    this->_wait_process_infinite = false;
  }
  else {
    if (DVar1.time_offset_ != 0x7fffffffffffffff) {
      this->_wait_process_infinite = false;
      return DVar1.time_offset_ / 1000;
    }
    this->_wait_process_infinite = true;
  }
  return 1;
}

Assistant:

int64_t QuickConnection::TimeUntilNextProcess()
{
	auto t = _pacing_sender->TimeUntilSend(_clock->Now(), _unacked_packet_map->bytes_in_flight());
	if (_wait_send_packets->GetPacketCount() == 0 && _wait_retransmission_packets.size() == 0)
		t = quic::QuicTime::Delta::FromMilliseconds(1);
	if (t.IsInfinite())
	{
		_wait_process_infinite = true;
		t = quic::QuicTime::Delta::FromMilliseconds(1);
	}
	else
		_wait_process_infinite = false;
	if (t.ToSeconds() > 5 && t.IsInfinite() == false)
		int a = 0;
	// test
	//return 0;
	return t.ToMilliseconds();
}